

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadDesc(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Desc *ds)

{
  DataKey *pDVar1;
  SPxOut *pSVar2;
  SPxId *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  char cVar6;
  bool bVar7;
  Status SVar8;
  int iVar9;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long in_FS_OFFSET;
  Verbosity old_verbosity;
  cpp_dec_float<50U,_int,_void> local_108;
  double local_c8;
  undefined8 uStack_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar2 = this->spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_108.data._M_elems[0] = pSVar2->m_verbosity;
    local_b8.data._M_elems[0] = 5;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar2->m_streams[pSVar2->m_verbosity],
               "IBASIS02 loading of Basis invalidates factorization",0x33);
    cVar6 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                    cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(DataKey *)&local_108);
  }
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = -1;
  iVar13 = 0;
  this->iterCount = 0;
  this->updateCount = 0;
  if (&this->thedesc != ds) {
    Desc::operator=(&this->thedesc,ds);
    setRep(this);
  }
  this->nzCount = 0;
  pSVar11 = this->theLP;
  iVar9 = (pSVar11->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  bVar7 = iVar9 < 1;
  if (0 < iVar9) {
    local_c8 = *(double *)(in_FS_OFFSET + -8);
    local_78 = SUB84(local_c8,0);
    uStack_c0 = 0;
    uStack_74 = (uint)((ulong)local_c8 >> 0x20) ^ 0x80000000;
    uStack_70 = 0;
    uStack_6c = 0x80000000;
    lVar15 = 0;
    lVar14 = 0;
    iVar13 = 0;
    do {
      if ((this->thedesc).rowstat.data[lVar14] < ~P_FREE) {
        pnVar4 = (pSVar11->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) == 2) ||
            (pnVar5 = (pSVar11->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar15 + 8U) == 2)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)(pnVar4->m_backend).data._M_elems + lVar15),
                               (cpp_dec_float<50U,_int,_void> *)
                               ((long)(pnVar5->m_backend).data._M_elems + lVar15)), iVar9 != 0)) {
          pnVar4 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_b8.fpclass = cpp_dec_float_finite;
          local_b8.prec_elem = 10;
          local_b8.data._M_elems[0] = 0;
          local_b8.data._M_elems[1] = 0;
          local_b8.data._M_elems[2] = 0;
          local_b8.data._M_elems[3] = 0;
          local_b8.data._M_elems[4] = 0;
          local_b8.data._M_elems[5] = 0;
          local_b8.data._M_elems._24_5_ = 0;
          local_b8.data._M_elems[7]._1_3_ = 0;
          local_b8.data._M_elems._32_5_ = 0;
          local_b8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_b8,(double)CONCAT44(uStack_74,local_78));
          if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
              (local_b8.fpclass != cpp_dec_float_NaN)) &&
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_b8),
             0 < iVar9)) {
            pnVar4 = (this->theLP->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_68,local_c8);
            if ((((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
                 (local_68.fpclass != cpp_dec_float_NaN)) &&
                (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)
                                    ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_68),
                -1 < iVar9)) || (SVar8 = (this->thedesc).rowstat.data[lVar14], SVar8 == P_ON_LOWER))
            {
LAB_00249091:
              SVar8 = P_ON_LOWER;
              goto LAB_0024909d;
            }
            if ((SVar8 != P_ON_UPPER) &&
               (pnVar4 = (this->theLP->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_108,0,(type *)0x0);
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_108);
              if (iVar9 < 1) goto LAB_00249091;
            }
          }
          pnVar4 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_108.fpclass = cpp_dec_float_finite;
          local_108.prec_elem = 10;
          local_108.data._M_elems[0] = 0;
          local_108.data._M_elems[1] = 0;
          local_108.data._M_elems[2] = 0;
          local_108.data._M_elems[3] = 0;
          local_108.data._M_elems[4] = 0;
          local_108.data._M_elems[5] = 0;
          local_108.data._M_elems._24_5_ = 0;
          local_108.data._M_elems[7]._1_3_ = 0;
          local_108.data._M_elems._32_5_ = 0;
          local_108._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_108,local_c8);
          if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) == 2) ||
              (local_108.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_108),
             -1 < iVar9)) {
            SVar8 = P_FREE;
          }
          else {
            SVar8 = P_ON_UPPER;
          }
        }
        else {
          SVar8 = P_FIXED;
        }
      }
      else {
        SVar8 = dualRowStatus(this,(int)lVar14);
      }
LAB_0024909d:
      (this->thedesc).rowstat.data[lVar14] = SVar8;
      if (0 < SVar8 * this->theLP->theRep) {
        if (iVar13 == (this->matrix).thesize) break;
        local_b8.data._M_elems._0_8_ =
             (this->theLP->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar14];
        SPxRowId::SPxRowId((SPxRowId *)&local_108,(DataKey *)&local_b8);
        pSVar3 = (this->theBaseId).data;
        pDVar1 = &pSVar3[iVar13].super_DataKey;
        pDVar1->info = local_108.data._M_elems[0];
        pDVar1->idx = local_108.data._M_elems[1];
        pSVar3[iVar13].super_DataKey.info = -1;
        pSVar10 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::vector(this->theLP,(SPxRowId *)&local_108);
        (this->matrix).data[iVar13] = pSVar10;
        this->nzCount = this->nzCount + (this->matrix).data[iVar13]->memused;
        iVar13 = iVar13 + 1;
      }
      lVar14 = lVar14 + 1;
      pSVar11 = this->theLP;
      lVar12 = (long)(pSVar11->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
      lVar15 = lVar15 + 0x38;
      bVar7 = lVar12 <= lVar14;
    } while (lVar14 < lVar12);
  }
  pSVar11 = this->theLP;
  if (0 < (pSVar11->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_c8 = *(double *)(in_FS_OFFSET + -8);
    local_78 = SUB84(local_c8,0);
    uStack_c0 = 0;
    uStack_74 = (uint)((ulong)local_c8 >> 0x20) ^ 0x80000000;
    uStack_70 = 0;
    uStack_6c = 0x80000000;
    lVar15 = 0;
    lVar14 = 0;
    do {
      if ((this->thedesc).colstat.data[lVar14] < ~P_FREE) {
        pnVar4 = (pSVar11->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) == 2) ||
            (pnVar5 = (pSVar11->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar15 + 8U) == 2)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)(pnVar4->m_backend).data._M_elems + lVar15),
                               (cpp_dec_float<50U,_int,_void> *)
                               ((long)(pnVar5->m_backend).data._M_elems + lVar15)), iVar9 != 0)) {
          pnVar4 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_b8.fpclass = cpp_dec_float_finite;
          local_b8.prec_elem = 10;
          local_b8.data._M_elems[0] = 0;
          local_b8.data._M_elems[1] = 0;
          local_b8.data._M_elems[2] = 0;
          local_b8.data._M_elems[3] = 0;
          local_b8.data._M_elems[4] = 0;
          local_b8.data._M_elems[5] = 0;
          local_b8.data._M_elems._24_5_ = 0;
          local_b8.data._M_elems[7]._1_3_ = 0;
          local_b8.data._M_elems._32_5_ = 0;
          local_b8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_b8,(double)CONCAT44(uStack_74,local_78));
          if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
              (local_b8.fpclass != cpp_dec_float_NaN)) &&
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_b8),
             0 < iVar9)) {
            pnVar4 = (this->theLP->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_68,local_c8);
            if ((((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
                 (local_68.fpclass != cpp_dec_float_NaN)) &&
                (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)
                                    ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_68),
                -1 < iVar9)) || (SVar8 = (this->thedesc).colstat.data[lVar14], SVar8 == P_ON_LOWER))
            {
LAB_0024939f:
              SVar8 = P_ON_LOWER;
              goto LAB_002493ab;
            }
            if ((SVar8 != P_ON_UPPER) &&
               (pnVar4 = (this->theLP->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_108,0,(type *)0x0);
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_108);
              if (iVar9 < 1) goto LAB_0024939f;
            }
          }
          pnVar4 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_108.fpclass = cpp_dec_float_finite;
          local_108.prec_elem = 10;
          local_108.data._M_elems[0] = 0;
          local_108.data._M_elems[1] = 0;
          local_108.data._M_elems[2] = 0;
          local_108.data._M_elems[3] = 0;
          local_108.data._M_elems[4] = 0;
          local_108.data._M_elems[5] = 0;
          local_108.data._M_elems._24_5_ = 0;
          local_108.data._M_elems[7]._1_3_ = 0;
          local_108.data._M_elems._32_5_ = 0;
          local_108._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_108,local_c8);
          if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) == 2) ||
              (local_108.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_108),
             -1 < iVar9)) {
            SVar8 = P_FREE;
          }
          else {
            SVar8 = P_ON_UPPER;
          }
        }
        else {
          SVar8 = P_FIXED;
        }
      }
      else {
        SVar8 = dualColStatus(this,(int)lVar14);
      }
LAB_002493ab:
      (this->thedesc).colstat.data[lVar14] = SVar8;
      if (0 < SVar8 * this->theLP->theRep) {
        if (iVar13 == (this->matrix).thesize) {
          bVar7 = false;
          break;
        }
        local_b8.data._M_elems._0_8_ =
             (this->theLP->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar14];
        SPxColId::SPxColId((SPxColId *)&local_108,(DataKey *)&local_b8);
        pSVar3 = (this->theBaseId).data;
        pDVar1 = &pSVar3[iVar13].super_DataKey;
        pDVar1->info = local_108.data._M_elems[0];
        pDVar1->idx = local_108.data._M_elems[1];
        pSVar3[iVar13].super_DataKey.info = 1;
        pSVar10 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::vector(this->theLP,(SPxColId *)&local_108);
        (this->matrix).data[iVar13] = pSVar10;
        this->nzCount = this->nzCount + (this->matrix).data[iVar13]->memused;
        iVar13 = iVar13 + 1;
      }
      lVar14 = lVar14 + 1;
      pSVar11 = this->theLP;
      lVar15 = lVar15 + 0x38;
    } while (lVar14 < (pSVar11->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if ((bVar7) && ((this->matrix).thesize <= iVar13)) {
    this->matrixIsSetup = true;
  }
  else {
    restoreInitialBasis(this);
  }
  this->factorized = false;
  if (this->factor !=
      (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}